

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::ReduceMeanLayerParams::MergePartialFromCodedStream
          (ReduceMeanLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  char cVar6;
  ulong uVar7;
  bool *value;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001cd33e;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001cd33e:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_001cd35f:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
    }
    else {
      uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
      cVar6 = (char)uVar7;
      if (uVar5 == 3) {
        value = &this->reduceall_;
        if (cVar6 == '\x18') {
LAB_001cd3c7:
          bVar3 = google::protobuf::internal::WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,value);
          goto LAB_001cd377;
        }
        goto LAB_001cd35f;
      }
      if (uVar5 == 2) {
        value = &this->keepdims_;
        if (cVar6 == '\x10') goto LAB_001cd3c7;
        goto LAB_001cd35f;
      }
      if (uVar5 != 1) goto LAB_001cd35f;
      if (cVar6 == '\b') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,10,input,&this->axes_);
      }
      else {
        if ((uVar4 & 0xff) != 10) goto LAB_001cd35f;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&this->axes_);
      }
    }
LAB_001cd377:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ReduceMeanLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ReduceMeanLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 axes = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_axes())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_axes())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool keepDims = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &keepdims_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reduceAll = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reduceall_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ReduceMeanLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ReduceMeanLayerParams)
  return false;
#undef DO_
}